

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

string * __thiscall
llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
          (string *__return_storage_ptr__,BuildSystemInvocation *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *cycle)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  Kind KVar4;
  raw_ostream *this_00;
  raw_svector_ostream *this_01;
  long *plVar5;
  char *pcVar6;
  StringRef Str;
  BuildKey key;
  raw_svector_ostream os;
  SmallString<256U> message;
  BuildKey local_190;
  raw_svector_ostream local_170;
  SmallVectorImpl<char> local_140;
  undefined1 local_130 [256];
  
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_130;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_170,&local_140);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"cycle detected while building: ");
  plVar5 = *(long **)this;
  plVar1 = (long *)(this->dbPath)._M_dataplus._M_p;
  bVar3 = true;
  do {
    if (plVar5 == plVar1) {
      local_190.key.key._M_dataplus._M_p =
           (pointer)((local_170.OS)->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      local_190.key.key._M_string_length =
           (size_type)
           ((local_170.OS)->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,(StringRef *)&local_190);
      llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_170);
      llvm::SmallVectorImpl<char>::~SmallVectorImpl(&local_140);
      return __return_storage_ptr__;
    }
    lVar2 = *plVar5;
    if (!bVar3) {
      llvm::raw_ostream::operator<<((raw_ostream *)&local_170," -> ");
    }
    BuildKey::fromData(&local_190,(KeyType *)(lVar2 + 8));
    KVar4 = BuildKey::getKind(&local_190);
    switch(KVar4) {
    case Command:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"command \'");
      Str = BuildKey::getCommandName(&local_190);
      break;
    case CustomTask:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"custom task \'");
      Str = BuildKey::getCustomTaskName(&local_190);
      break;
    case DirectoryContents:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"directory-contents \'");
      Str = BuildKey::getDirectoryPath(&local_190);
      break;
    case FilteredDirectoryContents:
      pcVar6 = "filtered-directory-contents \'";
      goto LAB_00147cce;
    case DirectoryTreeSignature:
      this_00 = llvm::raw_ostream::operator<<
                          ((raw_ostream *)&local_170,"directory-tree-signature \'");
      Str = BuildKey::getDirectoryTreeSignaturePath(&local_190);
      break;
    case DirectoryTreeStructureSignature:
      pcVar6 = "directory-tree-structure-signature \'";
LAB_00147cce:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,pcVar6);
      Str = BuildKey::getFilteredDirectoryPath(&local_190);
      break;
    case Node:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"node \'");
      Str = BuildKey::getNodeName(&local_190);
      break;
    case Stat:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"stat \'");
      Str = BuildKey::getStatName(&local_190);
      break;
    case Target:
      this_00 = llvm::raw_ostream::operator<<((raw_ostream *)&local_170,"target \'");
      Str = BuildKey::getTargetName(&local_190);
      break;
    case Unknown:
      pcVar6 = "((unknown))";
      this_01 = &local_170;
      goto LAB_00147d2b;
    default:
      goto switchD_00147c12_default;
    }
    this_01 = (raw_svector_ostream *)llvm::raw_ostream::operator<<(this_00,Str);
    pcVar6 = "\'";
LAB_00147d2b:
    llvm::raw_ostream::operator<<((raw_ostream *)this_01,pcVar6);
switchD_00147c12_default:
    std::__cxx11::string::_M_dispose();
    plVar5 = plVar5 + 1;
    bVar3 = false;
  } while( true );
}

Assistant:

std::string BuildSystemInvocation::formatDetectedCycle(const std::vector<core::Rule*>& cycle) {
  // Compute a description of the cycle path.
  SmallString<256> message;
  llvm::raw_svector_ostream os(message);
  os << "cycle detected while building: ";
  bool first = true;
  for (const auto* rule: cycle) {
    if (!first)
      os << " -> ";

    // Convert to a build key.
    auto key = BuildKey::fromData(rule->key);
    switch (key.getKind()) {
      case BuildKey::Kind::Unknown:
        os << "((unknown))";
        break;
      case BuildKey::Kind::Command:
        os << "command '" << key.getCommandName() << "'";
        break;
      case BuildKey::Kind::CustomTask:
        os << "custom task '" << key.getCustomTaskName() << "'";
        break;
      case BuildKey::Kind::DirectoryContents:
        os << "directory-contents '" << key.getDirectoryPath() << "'";
        break;
      case BuildKey::Kind::FilteredDirectoryContents:
        os << "filtered-directory-contents '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeSignature:
        os << "directory-tree-signature '"
        << key.getDirectoryTreeSignaturePath() << "'";
        break;
      case BuildKey::Kind::DirectoryTreeStructureSignature:
        os << "directory-tree-structure-signature '"
        << key.getFilteredDirectoryPath() << "'";
        break;
      case BuildKey::Kind::Node:
        os << "node '" << key.getNodeName() << "'";
        break;
      case BuildKey::Kind::Stat:
        os << "stat '" << key.getStatName() << "'";
        break;
      case BuildKey::Kind::Target:
        os << "target '" << key.getTargetName() << "'";
        break;
    }
    first = false;
  }

  return os.str().str();
}